

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O3

bool __thiscall EnrichableSpiAnalyzer::IsInitialClockPolarityCorrect(EnrichableSpiAnalyzer *this)

{
  BitState BVar1;
  U64 UVar2;
  bool bVar3;
  Frame error_frame;
  U64 local_40;
  U64 local_38;
  undefined1 local_1f;
  
  BVar1 = AnalyzerChannelData::GetBitState();
  bVar3 = true;
  if (BVar1 != ((this->mSettings)._M_ptr)->mClockInactiveState) {
    AnalyzerResults::AddMarker
              ((ulonglong)(this->mResults)._M_ptr,(MarkerType)this->mCurrentSample,(Channel *)0x3);
    if (this->mEnable == (AnalyzerChannelData *)0x0) {
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar2 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar2;
    }
    else {
      Frame::Frame((Frame *)&local_40);
      local_40 = this->mCurrentSample;
      AnalyzerChannelData::AdvanceToNextEdge();
      local_38 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = local_38;
      local_1f = 0x81;
      AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
      AnalyzerResults::CommitResults();
      Analyzer::ReportProgress((ulonglong)this);
      AnalyzerChannelData::AdvanceToNextEdge();
      UVar2 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar2;
      AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mClock);
      Frame::~Frame((Frame *)&local_40);
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool EnrichableSpiAnalyzer::IsInitialClockPolarityCorrect()
{
	if( mClock->GetBitState() == mSettings->mClockInactiveState )
		return true;

	mResults->AddMarker( mCurrentSample, AnalyzerResults::ErrorSquare, mSettings->mClockChannel );

	if( mEnable != NULL )
	{
		Frame error_frame;
		error_frame.mStartingSampleInclusive = mCurrentSample;

		mEnable->AdvanceToNextEdge();
		mCurrentSample = mEnable->GetSampleNumber();

		error_frame.mEndingSampleInclusive = mCurrentSample;
		error_frame.mFlags = SPI_ERROR_FLAG | DISPLAY_AS_ERROR_FLAG;
		mResults->AddFrame( error_frame );
		mResults->CommitResults();
		ReportProgress( error_frame.mEndingSampleInclusive );

		//move to the next active-going enable edge
		mEnable->AdvanceToNextEdge();
		mCurrentSample = mEnable->GetSampleNumber();
		mClock->AdvanceToAbsPosition( mCurrentSample );

		return false;
	}else
	{
		mClock->AdvanceToNextEdge();  //at least start with the clock in the idle state.
		mCurrentSample = mClock->GetSampleNumber();
		return true;
	}
}